

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grounder.cpp
# Opt level: O3

bool __thiscall
Kernel::GlobalSubsumptionGrounder::OrderNormalizingComparator::operator()
          (OrderNormalizingComparator *this,uint a,uint b)

{
  int iVar1;
  TermList TVar2;
  uint uVar3;
  Term *pTVar4;
  Term *t2;
  int iVar5;
  uint uVar6;
  Term *t1;
  bool bVar7;
  
  t1 = &this->_lits[a]->super_Term;
  t2 = &this->_lits[b]->super_Term;
  TVar2._content = 0;
  iVar1 = 0;
  if (t1 != t2) {
    pTVar4 = t1;
    if (*(int *)&t1->field_0xc < 0) {
      iVar1 = 0;
      do {
        pTVar4 = *(Term **)&(pTVar4->field_9)._vars;
        if (((ulong)pTVar4 & 1) != 0) {
          uVar3 = 3;
          goto LAB_005264e4;
        }
        iVar1 = iVar1 + 2;
      } while (*(int *)&pTVar4->field_0xc < 0);
    }
    uVar3 = (pTVar4->field_9)._vars;
LAB_005264e4:
    iVar5 = 0;
    pTVar4 = t2;
    if (*(int *)&t2->field_0xc < 0) {
      iVar5 = 0;
      do {
        pTVar4 = *(Term **)&(pTVar4->field_9)._vars;
        if (((ulong)pTVar4 & 1) != 0) {
          uVar6 = 3;
          goto LAB_00526511;
        }
        iVar5 = iVar5 + 2;
      } while (*(int *)&pTVar4->field_0xc < 0);
    }
    uVar6 = (pTVar4->field_9)._vars;
LAB_00526511:
    if (iVar1 + uVar3 == iVar5 + uVar6) {
      bVar7 = t1->_weight < t2->_weight;
      if ((t1->_weight == t2->_weight) &&
         (uVar3 = ((uint)t1->_args[0]._content >> 2 & 1) + t1->_functor * 2,
         uVar6 = ((uint)t2->_args[0]._content >> 2 & 1) + t2->_functor * 2, bVar7 = uVar3 < uVar6,
         uVar3 == uVar6)) {
        if (operator()(unsigned_int,unsigned_int)::dsit == '\0') {
          operator()();
        }
        DisagreementSetIterator::reset(&operator()::dsit,t1,t2,false);
        DisagreementSetIterator::hasNext(&operator()::dsit);
        TVar2 = operator()::dsit._arg1;
        operator()::dsit._arg1._content = 2;
        if ((((uint)TVar2._content ^ (uint)operator()::dsit._arg2._content) & 1) != 0)
        goto LAB_005265f5;
        if ((TVar2._content & 1) == 0) {
          bVar7 = *(uint *)(TVar2._content + 8) < *(uint *)(operator()::dsit._arg2._content + 8);
        }
        else {
          bVar7 = (uint)(TVar2._content >> 2) < (uint)(operator()::dsit._arg2._content >> 2);
        }
      }
    }
    else {
      iVar1 = 0;
      if (*(int *)&t1->field_0xc < 0) {
        iVar1 = 0;
        do {
          t1 = *(Term **)&(t1->field_9)._vars;
          if (((ulong)t1 & 1) != 0) {
            uVar3 = 3;
            goto LAB_005265cf;
          }
          iVar1 = iVar1 + 2;
        } while (*(int *)&t1->field_0xc < 0);
      }
      uVar3 = (t1->field_9)._vars;
LAB_005265cf:
      iVar5 = 0;
      if (*(int *)&t2->field_0xc < 0) {
        iVar5 = 0;
        do {
          t2 = *(Term **)&(t2->field_9)._vars;
          if (((ulong)t2 & 1) != 0) {
            uVar6 = 3;
            goto LAB_005265ee;
          }
          iVar5 = iVar5 + 2;
        } while (*(int *)&t2->field_0xc < 0);
      }
      uVar6 = (t2->field_9)._vars;
LAB_005265ee:
      bVar7 = iVar1 + uVar3 < iVar5 + uVar6;
    }
    TVar2._content = (uint64_t)bVar7;
  }
LAB_005265f5:
  return (bool)((byte)TVar2._content & 1);
}

Assistant:

bool operator()(unsigned a, unsigned b) {
    Literal* la = _lits[a];
    Literal* lb = _lits[b];
    if(la==lb) { return false; }
    if(la->numVarOccs()!=lb->numVarOccs()) {
      //first, we want literals with less variables to appear in the
      //beginning as there is better chance to get some sharing across clauses
      return la->numVarOccs()<lb->numVarOccs();
    }
    if(la->weight()!=lb->weight()) {
      return la->weight()<lb->weight();
    }
    if(la->header()!=lb->header()) {
      return la->header()<lb->header();
    }
    //now get just some total deterministic order
    static DisagreementSetIterator dsit;
    dsit.reset(la, lb, false);
    ALWAYS(dsit.hasNext());
    auto da = dsit.next();
    if(da.first.isVar()!=da.second.isVar()) {
      return da.first.isVar();
    }
    if(da.first.isVar()) {
      ASS_NEQ(da.first.var(),da.second.var());
      return da.first.var()<da.second.var();
    }
    else {
      ASS_NEQ(da.first.term()->functor(),da.second.term()->functor());
      return da.first.term()->functor()<da.second.term()->functor();
    }
    return a<b; //if nothing else applies, we keep the original order
  }